

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int array_container_rank(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (arr->cardinality < 1) {
    return 0;
  }
  iVar4 = arr->cardinality + -1;
  iVar3 = 0;
  do {
    uVar2 = (uint)(iVar4 + iVar3) >> 1;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(iVar4 + iVar3 & 0xfffffffe));
    if (uVar1 < x) {
      iVar3 = uVar2 + 1;
    }
    else {
      if (uVar1 <= x) {
        return uVar2 + 1;
      }
      iVar4 = uVar2 - 1;
    }
  } while (iVar3 <= iVar4);
  iVar4 = -iVar3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

inline int array_container_rank(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx + 1;
    } else {
        return -idx - 1;
    }
}